

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Material.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::ParseNode_Texture(AMFImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  CAMFImporter_NodeElement_Texture *this_00;
  ulong uVar5;
  size_type sVar6;
  DeadlyImportError *pDVar7;
  allocator local_1e9;
  string local_1e8;
  undefined1 local_1c2;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8;
  CAMFImporter_NodeElement_Texture *local_d8;
  CAMFImporter_NodeElement_Texture *als;
  CAMFImporter_NodeElement *ne;
  undefined1 local_c0 [8];
  string an;
  uint local_8c;
  int idx_end;
  int idx;
  string enc64_data;
  undefined1 local_60 [7];
  bool tiled;
  string type;
  uint local_38;
  uint32_t depth;
  uint32_t height;
  uint32_t width;
  string id;
  AMFImporter *this_local;
  
  id.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&height);
  depth = 0;
  local_38 = 0;
  type.field_2._12_4_ = 1;
  std::__cxx11::string::string((string *)local_60);
  enc64_data.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)&idx_end);
  local_8c = 0;
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  for (; (int)local_8c < iVar2; local_8c = local_8c + 1) {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,(ulong)local_8c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_c0,(char *)CONCAT44(extraout_var,iVar3),(allocator *)((long)&ne + 7))
    ;
    std::allocator<char>::~allocator((allocator<char> *)((long)&ne + 7));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c0,"id");
    if (bVar1) {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_8c);
      std::__cxx11::string::operator=((string *)&height,(char *)CONCAT44(extraout_var_00,iVar3));
      ne._0_4_ = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c0,"width");
      if (bVar1) {
        depth = XML_ReadNode_GetAttrVal_AsU32(this,local_8c);
        ne._0_4_ = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c0,"height");
        if (bVar1) {
          local_38 = XML_ReadNode_GetAttrVal_AsU32(this,local_8c);
          ne._0_4_ = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_c0,"depth");
          if (bVar1) {
            type.field_2._12_4_ = XML_ReadNode_GetAttrVal_AsU32(this,local_8c);
            ne._0_4_ = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_c0,"type");
            if (bVar1) {
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_8c);
              std::__cxx11::string::operator=
                        ((string *)local_60,(char *)CONCAT44(extraout_var_01,iVar3));
              ne._0_4_ = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_c0,"tiled");
              if (bVar1) {
                enc64_data.field_2._M_local_buf[0xf] = XML_ReadNode_GetAttrVal_AsBool(this,local_8c)
                ;
                ne._0_4_ = 4;
              }
              else {
                Throw_IncorrectAttr(this,(string *)local_c0);
                ne._0_4_ = 0;
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_c0);
  }
  this_00 = (CAMFImporter_NodeElement_Texture *)operator_new(0x88);
  CAMFImporter_NodeElement_Texture::CAMFImporter_NodeElement_Texture(this_00,this->mNodeElement_Cur)
  ;
  local_d8 = this_00;
  als = this_00;
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar4 & 1) == 0) {
    XML_ReadNode_GetVal_AsString(this,(string *)&idx_end);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    if (depth == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_120,"width",&local_121);
      Throw_IncorrectAttrValue(this,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
    }
    if (local_38 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_148,"height",&local_149);
      Throw_IncorrectAttrValue(this,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
    }
    if (type.field_2._12_4_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_170,"depth",&local_171);
      Throw_IncorrectAttrValue(this,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
    }
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_60,"grayscale");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_198,"type",&local_199);
      Throw_IncorrectAttrValue(this,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&(local_d8->super_CAMFImporter_NodeElement).ID,(string *)&height);
      local_d8->Width = (ulong)depth;
      local_d8->Height = (ulong)local_38;
      local_d8->Depth = (ulong)(uint)type.field_2._12_4_;
      local_d8->Tiled = (bool)(enc64_data.field_2._M_local_buf[0xf] & 1);
      ParseHelper_Decode_Base64(this,(string *)&idx_end,&local_d8->Data);
      uVar4 = depth * local_38 * type.field_2._12_4_;
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_d8->Data);
      if (uVar4 != sVar6) {
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1e8,"Texture has incorrect data size.",&local_1e9);
        DeadlyImportError::DeadlyImportError(pDVar7,&local_1e8);
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
      push_back(&this->mNodeElement_Cur->Child,(value_type *)&als);
      std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
      push_back(&this->mNodeElement_List,(value_type *)&als);
      std::__cxx11::string::~string((string *)&idx_end);
      std::__cxx11::string::~string((string *)local_60);
      std::__cxx11::string::~string((string *)&height);
      return;
    }
    local_1c2 = 1;
    pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c0,"Texture data not defined.",&local_1c1);
    DeadlyImportError::DeadlyImportError(pDVar7,&local_1c0);
    local_1c2 = 0;
    __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  local_fa = 1;
  pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"ID for texture must be defined.",&local_f9);
  DeadlyImportError::DeadlyImportError(pDVar7,&local_f8);
  local_fa = 0;
  __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void AMFImporter::ParseNode_Texture()
{
    std::string id;
    uint32_t width = 0;
    uint32_t height = 0;
    uint32_t depth = 1;
    std::string type;
    bool tiled = false;
    std::string enc64_data;

	// Read attributes for node <color>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("id", id, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("width", width, XML_ReadNode_GetAttrVal_AsU32);
		MACRO_ATTRREAD_CHECK_RET("height", height, XML_ReadNode_GetAttrVal_AsU32);
		MACRO_ATTRREAD_CHECK_RET("depth", depth, XML_ReadNode_GetAttrVal_AsU32);
		MACRO_ATTRREAD_CHECK_RET("type", type, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("tiled", tiled, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// create new texture object.
    CAMFImporter_NodeElement *ne = new CAMFImporter_NodeElement_Texture(mNodeElement_Cur);

	CAMFImporter_NodeElement_Texture& als = *((CAMFImporter_NodeElement_Texture*)ne);// alias for convenience

	// Check for child nodes
    if (!mReader->isEmptyElement()) {
        XML_ReadNode_GetVal_AsString(enc64_data);
    }

	// check that all components was defined
    if (id.empty()) {
        throw DeadlyImportError("ID for texture must be defined.");
    }
    if (width < 1) {
        Throw_IncorrectAttrValue("width");
    }
    if (height < 1) {
        Throw_IncorrectAttrValue("height");
    }
    if (depth < 1) {
        Throw_IncorrectAttrValue("depth");
    }
    if (type != "grayscale") {
        Throw_IncorrectAttrValue("type");
    }
    if (enc64_data.empty()) {
        throw DeadlyImportError("Texture data not defined.");
    }
	// copy data
	als.ID = id;
	als.Width = width;
	als.Height = height;
	als.Depth = depth;
	als.Tiled = tiled;
	ParseHelper_Decode_Base64(enc64_data, als.Data);

    // check data size
    if ((width * height * depth) != als.Data.size()) {
        throw DeadlyImportError("Texture has incorrect data size.");
    }

	mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}